

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alconfig.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::expdup_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *str)

{
  _anonymous_namespace_ _Var1;
  _anonymous_namespace_ _Var2;
  int iVar3;
  char *pcVar4;
  _Alloc_hider __s;
  _anonymous_namespace_ *p_Var5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string envname;
  string envval;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  envval._M_dataplus._M_p = (pointer)&envval.field_2;
  envval._M_string_length = 0;
  envval.field_2._M_local_buf[0] = '\0';
  while( true ) {
    if (*this != (_anonymous_namespace_)0x24) break;
    __s._M_p = (pointer)(this + 1);
    _Var1 = this[1];
    if (_Var1 == (_anonymous_namespace_)0x24) {
      pcVar4 = strchr((char *)(this + 2),0x24);
      if (pcVar4 == (char *)0x0) {
        sVar6 = strlen(__s._M_p);
      }
      else {
        sVar6 = (long)pcVar4 - (long)__s._M_p;
      }
      p_Var5 = (_anonymous_namespace_ *)__s._M_p + sVar6;
      goto LAB_00137fa2;
    }
    p_Var5 = this + 2;
    if (_Var1 != (_anonymous_namespace_)0x7b) {
      p_Var5 = (_anonymous_namespace_ *)__s._M_p;
    }
    this = p_Var5 + -1;
    do {
      do {
        _Var2 = this[1];
        this = this + 1;
        iVar3 = isalnum((int)(char)_Var2);
      } while ((char)_Var2 == 0x5f);
    } while (iVar3 != 0);
    if ((_Var1 != (_anonymous_namespace_)0x7b) || (_Var2 == (_anonymous_namespace_)0x7d)) {
      envname._M_dataplus._M_p = (pointer)&envname.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&envname,p_Var5,this);
      al::getenv_abi_cxx11_((al *)&local_78,envname._M_dataplus._M_p);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      al::optional<std::__cxx11::string>::value_or<std::__cxx11::string>
                (&local_50,(optional<std::__cxx11::string> *)&local_78,&local_d8);
      p_Var5 = this + (_Var1 == (_anonymous_namespace_)0x7b);
      std::__cxx11::string::operator=((string *)&envval,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d8);
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional(&local_78);
      sVar6 = envval._M_string_length;
      __s = envval._M_dataplus;
      std::__cxx11::string::~string((string *)&envname);
LAB_00137fa2:
      this = p_Var5;
      if (sVar6 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)__s._M_p);
      }
    }
  }
  if (*this == (_anonymous_namespace_)0x0) {
    std::__cxx11::string::~string((string *)&envval);
    return __return_storage_ptr__;
  }
  pcVar4 = strchr((char *)this,0x24);
  if (pcVar4 == (char *)0x0) {
    sVar6 = strlen((char *)this);
  }
  else {
    sVar6 = (long)pcVar4 - (long)this;
  }
  p_Var5 = this + sVar6;
  __s._M_p = (pointer)this;
  goto LAB_00137fa2;
}

Assistant:

std::string expdup(const char *str)
{
    std::string output;

    std::string envval;
    while(*str != '\0')
    {
        const char *addstr;
        size_t addstrlen;

        if(str[0] != '$')
        {
            const char *next = std::strchr(str, '$');
            addstr = str;
            addstrlen = next ? static_cast<size_t>(next-str) : std::strlen(str);

            str += addstrlen;
        }
        else
        {
            str++;
            if(*str == '$')
            {
                const char *next = std::strchr(str+1, '$');
                addstr = str;
                addstrlen = next ? static_cast<size_t>(next-str) : std::strlen(str);

                str += addstrlen;
            }
            else
            {
                const bool hasbraces{(*str == '{')};

                if(hasbraces) str++;
                const char *envstart = str;
                while(std::isalnum(*str) || *str == '_')
                    ++str;
                if(hasbraces && *str != '}')
                    continue;
                const std::string envname{envstart, str};
                if(hasbraces) str++;

                envval = al::getenv(envname.c_str()).value_or(std::string{});
                addstr = envval.data();
                addstrlen = envval.length();
            }
        }
        if(addstrlen == 0)
            continue;

        output.append(addstr, addstrlen);
    }

    return output;
}